

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cinatra.cpp
# Opt level: O0

bool __thiscall dely_t::before(dely_t *this,coro_http_request *req,coro_http_response *res)

{
  string_view client_encoding_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  coro_http_response *in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  anon_class_8_1_29cdea3e *in_stack_00000040;
  any user_data;
  coro_http_request *in_stack_ffffffffffffff68;
  allocator<char> *__str;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  allocator<char> local_61;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  content_encoding in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  status_type status;
  
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8;
  cinatra::coro_http_request::get_user_data(in_stack_ffffffffffffff68);
  before::anon_class_8_1_29cdea3e::operator()(in_stack_00000040);
  __str = &local_61;
  pbVar1 = in_RDX;
  std::allocator<char>::allocator();
  status = (status_type)((ulong)pbVar1 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
  client_encoding_type._M_str = unaff_retaddr;
  client_encoding_type._M_len = in_RDI;
  cinatra::coro_http_response::set_status_and_content
            (in_RSI,status,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,client_encoding_type)
  ;
  std::__cxx11::string::~string(in_RDX);
  std::allocator<char>::~allocator(&local_61);
  std::any::~any((any *)0x65b124);
  return false;
}

Assistant:

bool before(coro_http_request &req, coro_http_response &res) {
    auto user_data = req.get_user_data();
    CHECK(!user_data.has_value());
    res.set_status_and_content(status_type::unauthorized, "unauthorized");
    return false;
  }